

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,int nodeType,xmlChar *value,int len,int mode,
                      int *consumed)

{
  int *piVar1;
  uint uVar2;
  xmlSchemaContentType xVar3;
  int iVar4;
  xmlSchemaNodeInfoPtr pxVar5;
  xmlChar *pxVar6;
  xmlParserErrors error;
  char *message;
  
  pxVar5 = vctxt->inode;
  uVar2 = pxVar5->flags;
  if ((uVar2 & 4) == 0) {
    xVar3 = pxVar5->typeDef->contentType;
    if (xVar3 == XML_SCHEMA_CONTENT_ELEMENTS) {
      if ((nodeType == 3) && (iVar4 = xmlSchemaIsBlank(value,len), iVar4 != 0)) {
        return 0;
      }
      message = 
      "Character content other than whitespace is not allowed because the content type is \'element-only\'"
      ;
      error = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3;
    }
    else {
      if (xVar3 != XML_SCHEMA_CONTENT_EMPTY) {
        if (value == (xmlChar *)0x0) {
          return 0;
        }
        if (*value == '\0') {
          return 0;
        }
        if (xVar3 == XML_SCHEMA_CONTENT_MIXED) {
          if (pxVar5->decl == (xmlSchemaElementPtr)0x0) {
            return 0;
          }
          if (pxVar5->decl->value == (xmlChar *)0x0) {
            return 0;
          }
        }
        if (pxVar5->value == (xmlChar *)0x0) {
          if (mode != 3) {
            if (mode == 2) {
              pxVar5->value = value;
              pxVar5->flags = uVar2 | 2;
              return 0;
            }
            pxVar5->value = value;
            return 0;
          }
          if (len == -1) {
            pxVar6 = xmlStrdup(value);
          }
          else {
            pxVar6 = xmlStrndup(value,len);
          }
        }
        else {
          if (len < 0) {
            len = xmlStrlen(value);
            pxVar5 = vctxt->inode;
            uVar2 = pxVar5->flags;
          }
          if ((uVar2 & 2) != 0) {
            pxVar6 = xmlStrncat(pxVar5->value,value,len);
            vctxt->inode->value = pxVar6;
            return 0;
          }
          pxVar6 = xmlStrncatNew(pxVar5->value,value,len);
        }
        pxVar5 = vctxt->inode;
        pxVar5->value = pxVar6;
        piVar1 = &pxVar5->flags;
        *(byte *)piVar1 = (byte)*piVar1 | 2;
        return 0;
      }
      message = "Character content is not allowed, because the content type is empty";
      error = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1;
    }
  }
  else {
    message = "Neither character nor element content is allowed because the element is \'nilled\'";
    error = XML_SCHEMAV_CVC_ELT_3_2_1;
  }
  xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,error,(xmlNodePtr)0x0,
                     (xmlSchemaBasicItemPtr)0x0,message,(xmlChar *)0x0,(xmlChar *)0x0);
  return vctxt->err;
}

Assistant:

static int
xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,
		  int nodeType, const xmlChar *value, int len,
		  int mode, int *consumed)
{
    /*
    * Unfortunately we have to duplicate the text sometimes.
    * OPTIMIZE: Maybe we could skip it, if:
    *   1. content type is simple
    *   2. whitespace is "collapse"
    *   3. it consists of whitespace only
    *
    * Process character content.
    */
    if (consumed != NULL)
	*consumed = 0;
    if (INODE_NILLED(vctxt->inode)) {
	/*
	* SPEC cvc-elt (3.3.4 - 3.2.1)
	* "The element information item must have no character or
	* element information item [children]."
	*/
	VERROR(XML_SCHEMAV_CVC_ELT_3_2_1, NULL,
	    "Neither character nor element content is allowed "
	    "because the element is 'nilled'");
	return (vctxt->err);
    }
    /*
    * SPEC (2.1) "If the {content type} is empty, then the
    * element information item has no character or element
    * information item [children]."
    */
    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_EMPTY) {
	VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1, NULL,
	    "Character content is not allowed, "
	    "because the content type is empty");
	return (vctxt->err);
    }

    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_ELEMENTS) {
	if ((nodeType != XML_TEXT_NODE) ||
	    (! xmlSchemaIsBlank((xmlChar *) value, len))) {
	    /*
	    * SPEC cvc-complex-type (2.3)
	    * "If the {content type} is element-only, then the
	    * element information item has no character information
	    * item [children] other than those whose [character
	    * code] is defined as a white space in [XML 1.0 (Second
	    * Edition)]."
	    */
	    VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3, NULL,
		"Character content other than whitespace is not allowed "
		"because the content type is 'element-only'");
	    return (vctxt->err);
	}
	return (0);
    }

    if ((value == NULL) || (value[0] == 0))
	return (0);
    /*
    * Save the value.
    * NOTE that even if the content type is *mixed*, we need the
    * *initial value* for default/fixed value constraints.
    */
    if ((vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	((vctxt->inode->decl == NULL) ||
	(vctxt->inode->decl->value == NULL)))
	return (0);

    if (vctxt->inode->value == NULL) {
	/*
	* Set the value.
	*/
	switch (mode) {
	    case XML_SCHEMA_PUSH_TEXT_PERSIST:
		/*
		* When working on a tree.
		*/
		vctxt->inode->value = value;
		break;
	    case XML_SCHEMA_PUSH_TEXT_CREATED:
		/*
		* When working with the reader.
		* The value will be freed by the element info.
		*/
		vctxt->inode->value = value;
		if (consumed != NULL)
		    *consumed = 1;
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    case XML_SCHEMA_PUSH_TEXT_VOLATILE:
		/*
		* When working with SAX.
		* The value will be freed by the element info.
		*/
		if (len != -1)
		    vctxt->inode->value = BAD_CAST xmlStrndup(value, len);
		else
		    vctxt->inode->value = BAD_CAST xmlStrdup(value);
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    default:
		break;
	}
    } else {
	if (len < 0)
	    len = xmlStrlen(value);
	/*
	* Concat the value.
	*/
	if (vctxt->inode->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    vctxt->inode->value = BAD_CAST xmlStrncat(
		(xmlChar *) vctxt->inode->value, value, len);
	} else {
	    vctxt->inode->value =
		BAD_CAST xmlStrncatNew(vctxt->inode->value, value, len);
	    vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
	}
    }

    return (0);
}